

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  string configurationFile;
  Restaurant rest;
  string local_a0;
  Restaurant local_80;
  
  if (argc == 2) {
    std::__cxx11::string::string((string *)&local_a0,argv[1],(allocator *)&local_80);
    Restaurant::Restaurant(&local_80,&local_a0);
    Restaurant::start(&local_80);
    if (backup != (Restaurant *)0x0) {
      (*backup->_vptr_Restaurant[1])();
      backup = (Restaurant *)0x0;
    }
    Restaurant::~Restaurant(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"usage: rest <config_path>",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  return 0;
}

Assistant:

int main(int argc, char** argv){
    if(argc!=2){
        std::cout << "usage: rest <config_path>" << std::endl;
        return 0;
    }
    string configurationFile = argv[1];
    Restaurant rest(configurationFile);
    rest.start();
    if(backup!=nullptr){
        delete backup;
        backup = nullptr;
    }
    return 0;
}